

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TElasticity3DAnalytic::graduxy<double>
          (TElasticity3DAnalytic *this,TPZVec<double> *x,TPZFMatrix<double> *grad)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  int i;
  long lVar6;
  int j;
  int sz;
  ulong uVar7;
  ulong row;
  TPZManVector<Fad<double>,_3> result;
  TPZManVector<Fad<double>,_3> xfad;
  
  uVar2 = x->fNElements;
  sz = (int)uVar2;
  TPZManVector<Fad<double>,_3>::TPZManVector(&xfad,(long)sz);
  lVar6 = 0;
  uVar3 = 0;
  if (0 < sz) {
    uVar3 = uVar2 & 0xffffffff;
  }
  lVar5 = 0;
  for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
    Fad<double>::Fad((Fad<double> *)&result,sz,(int)uVar7,(double *)((long)x->fStore + lVar5));
    Fad<double>::operator=
              ((Fad<double> *)((long)&(xfad.super_TPZVec<Fad<double>_>.fStore)->val_ + lVar6),
               (Fad<double> *)&result);
    Fad<double>::~Fad((Fad<double> *)&result);
    lVar5 = lVar5 + 8;
    lVar6 = lVar6 + 0x20;
  }
  TPZManVector<Fad<double>,_3>::TPZManVector(&result,3);
  uxy<Fad<double>>(this,&xfad.super_TPZVec<Fad<double>_>,&result.super_TPZVec<Fad<double>_>);
  (*(grad->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (grad,(long)sz);
  for (uVar7 = 0; uVar7 != uVar3; uVar7 = uVar7 + 1) {
    for (row = 0; (uVar2 & 0xffffffff) != row; row = row + 1) {
      dVar1 = result.super_TPZVec<Fad<double>_>.fStore[uVar7].dx_.ptr_to_data[row];
      pdVar4 = TPZFMatrix<double>::operator()(grad,row,uVar7);
      *pdVar4 = dVar1;
    }
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(&result);
  TPZManVector<Fad<double>,_3>::~TPZManVector(&xfad);
  return;
}

Assistant:

void TElasticity3DAnalytic::graduxy(const TPZVec<TVar> &x, TPZFMatrix<TVar> &grad) const
{
    int sz = x.size();
#ifdef PZDEBUG
    if(sz != 3)
    {
        DebugStop();
    }
#endif
    TPZManVector<Fad<TVar>,3> xfad(sz);
    for(int i=0; i<sz; i++)
    {
        Fad<TVar> temp = Fad<TVar>(sz,i,x[i]);
        xfad[i] = temp;
        
    }
    TPZManVector<Fad<TVar>,3> result(3);
    uxy(xfad,result);
    grad.Resize(sz,sz);
    for (int i=0; i<sz; i++) {
        for (int j=0; j<sz; j++)
        {
            grad(j,i) = result[i].d(j);
        }
    }
    
}